

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall
ghc::filesystem::path::
path<std::basic_string_view<char,std::char_traits<char>>,ghc::filesystem::path>
          (path *this,string_view *source,format fmt)

{
  format fmt_00;
  string *psVar1;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  (this->_path)._M_dataplus._M_p = (pointer)&(this->_path).field_2;
  (this->_path)._M_string_length = 0;
  (this->_path).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_50,source,&local_51);
  detail::toUtf8<char,_std::char_traits<char>,_std::allocator<char>,_1>(&local_30,&local_50);
  psVar1 = &local_30;
  std::__cxx11::string::operator=((string *)this,(string *)&local_30);
  fmt_00 = (format)psVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  postprocess_path_with_format(&this->_path,fmt_00);
  return;
}

Assistant:

inline path::path(const std::string_view& source, format fmt)
{
    _path = detail::toUtf8(std::string(source));
    postprocess_path_with_format(_path, fmt);
}